

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

Vec_Int_t *
Gla_ManUnsatCore(Gla_Man_t *p,int f,sat_solver2 *pSat,int nConfMax,int fVerbose,int *piRetValue,
                int *pnConfls)

{
  ABC_INT64_T AVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int iLit;
  
  AVar1 = (pSat->stats).conflicts;
  iVar2 = Gla_ManGetOutLit(p,f);
  iLit = iVar2;
  Abc_Clock();
  if (piRetValue != (int *)0x0) {
    *piRetValue = 1;
  }
  if (iVar2 == -1) {
    pVVar3 = Vec_IntAlloc(1);
    Vec_IntPush(pVVar3,p->pObjRoot->Fanins[0]);
  }
  else {
    iVar2 = sat_solver2_solve(pSat,&iLit,(lit *)&stack0xffffffffffffffd0,(long)nConfMax,0,0,0);
    if (pnConfls != (int *)0x0) {
      *pnConfls = (int)(pSat->stats).conflicts - (int)AVar1;
    }
    if (iVar2 == -1) {
      Abc_Clock();
      pVVar3 = (Vec_Int_t *)Sat_ProofCore(pSat);
      if (pVVar3 != (Vec_Int_t *)0x0) {
        Vec_IntSort(pVVar3,1);
        return pVVar3;
      }
    }
    else if (iVar2 == 1) {
      if (piRetValue != (int *)0x0) {
        *piRetValue = 0;
      }
    }
    else {
      if (iVar2 != 0) {
        __assert_fail("RetValue == l_False",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                      ,0x5cb,
                      "Vec_Int_t *Gla_ManUnsatCore(Gla_Man_t *, int, sat_solver2 *, int, int, int *, int *)"
                     );
      }
      if (piRetValue != (int *)0x0) {
        *piRetValue = -1;
      }
    }
    pVVar3 = (Vec_Int_t *)0x0;
  }
  return pVVar3;
}

Assistant:

Vec_Int_t * Gla_ManUnsatCore( Gla_Man_t * p, int f, sat_solver2 * pSat, int nConfMax, int fVerbose, int * piRetValue, int * pnConfls )
{
    Vec_Int_t * vCore = NULL;
    int nConfPrev = pSat->stats.conflicts;
    int RetValue, iLit = Gla_ManGetOutLit( p, f );
    abctime clk = Abc_Clock();
    if ( piRetValue )
        *piRetValue = 1;
    // consider special case when PO points to the flop
    // this leads to immediate conflict in the first timeframe
    if ( iLit == -1 )
    {
        vCore = Vec_IntAlloc( 1 );
        Vec_IntPush( vCore, p->pObjRoot->Fanins[0] );
        return vCore;
    }
    // solve the problem
    RetValue = sat_solver2_solve( pSat, &iLit, &iLit+1, (ABC_INT64_T)nConfMax, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( pnConfls )
        *pnConfls = (int)pSat->stats.conflicts - nConfPrev;
    if ( RetValue == l_Undef )
    {
        if ( piRetValue )
            *piRetValue = -1;
        return NULL;
    }
    if ( RetValue == l_True )
    {
        if ( piRetValue )
            *piRetValue = 0;
        return NULL;
    }
    if ( fVerbose )
    {
//        Abc_Print( 1, "%6d", (int)pSat->stats.conflicts - nConfPrev );
//        Abc_Print( 1, "UNSAT after %7d conflicts.      ", pSat->stats.conflicts );
//        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    assert( RetValue == l_False );
    // derive the UNSAT core
    clk = Abc_Clock();
    vCore = (Vec_Int_t *)Sat_ProofCore( pSat );
    if ( vCore )
        Vec_IntSort( vCore, 1 );
    if ( fVerbose )
    {
//        Abc_Print( 1, "Core is %8d vars    (out of %8d).   ", Vec_IntSize(vCore), sat_solver2_nvars(pSat) );
//        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    return vCore;
}